

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::genFragmentSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  char *local_1c8;
  ostringstream local_198 [8];
  ostringstream buf;
  char *colorInputName;
  PointRenderCase *this_local;
  
  if ((*(byte *)((long)this + 0x81) & 1) == 0) {
    local_1c8 = "vtx_color";
    if ((*(byte *)((long)this + 0x80) & 1) != 0) {
      local_1c8 = "tess_color";
    }
  }
  else {
    local_1c8 = "geo_color";
  }
  buf._368_8_ = local_1c8;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"${GLSL_VERSION_DECL}\nin mediump vec4 ");
  poVar1 = std::operator<<(poVar1,(char *)buf._368_8_);
  poVar1 = std::operator<<(poVar1,";\nlayout(location = 0) out mediump vec4 o_color;\n");
  pcVar2 = anon_unknown_1::BBoxRenderCase::genShaderFunction
                     ((BBoxRenderCase *)this,SHADER_FUNC_INSIDE_BBOX);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"\nvoid main()\n{\n\tmediump vec4 baseColor = ");
  poVar1 = std::operator<<(poVar1,(char *)buf._368_8_);
  std::operator<<(poVar1,
                  ";\n\tmediump float redChannel;\n\tif (fragmentInsideTheBBox(gl_FragCoord.z))\n\t\tredChannel = 0.0;\n\telse\n\t\tredChannel = 1.0;\n\to_color = vec4(redChannel, baseColor.g, baseColor.b, baseColor.a);\n}\n"
                 );
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string PointRenderCase::genFragmentSource (void) const
{
	const char* const	colorInputName = (m_hasGeometryStage) ? ("geo_color") : (m_hasTessellationStage) ? ("tess_color") : ("vtx_color");
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in mediump vec4 " << colorInputName << ";\n"
			"layout(location = 0) out mediump vec4 o_color;\n"
		<<	genShaderFunction(SHADER_FUNC_INSIDE_BBOX)
		<<	"\n"
			"void main()\n"
			"{\n"
			"	mediump vec4 baseColor = " << colorInputName << ";\n"
			"	mediump float redChannel;\n"
			"	if (fragmentInsideTheBBox(gl_FragCoord.z))\n"
			"		redChannel = 0.0;\n"
			"	else\n"
			"		redChannel = 1.0;\n"
			"	o_color = vec4(redChannel, baseColor.g, baseColor.b, baseColor.a);\n"
			"}\n";

	return buf.str();
}